

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::UmulExtendedCaseInstance::getInputValues
          (UmulExtendedCaseInstance *this,int numValues,void **values)

{
  long lVar1;
  long lVar2;
  deUint32 dVar3;
  DataType dataType;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  const_reference pvVar8;
  int adj1;
  int adj0;
  deUint32 base1;
  deUint32 base0;
  int compNdx_1;
  int compNdx;
  int easyCaseNdx;
  anon_struct_8_2_947311e6 easyCases [6];
  int local_5c;
  int valueNdx;
  deUint32 *in1;
  deUint32 *in0;
  int scalarSize;
  DataType type;
  Random rnd;
  void **values_local;
  int numValues_local;
  UmulExtendedCaseInstance *this_local;
  
  rnd.m_rnd._8_8_ = values;
  dVar3 = deStringHash((this->super_IntegerFunctionTestInstance).m_name);
  de::Random::Random((Random *)&scalarSize,dVar3 ^ 0x235fac);
  pvVar8 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_IntegerFunctionTestInstance).m_spec.inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar8->varType);
  iVar4 = glu::getDataTypeScalarSize(dataType);
  lVar1 = *(long *)rnd.m_rnd._8_8_;
  lVar2 = *(long *)(rnd.m_rnd._8_8_ + 8);
  local_5c = 0;
  memcpy(&compNdx,&DAT_01389e00,0x30);
  for (compNdx_1 = 0; compNdx_1 < 6; compNdx_1 = compNdx_1 + 1) {
    for (base0 = 0; (int)base0 < iVar4; base0 = base0 + 1) {
      *(int *)(lVar1 + (long)(int)(local_5c * iVar4 + base0) * 4) = (&compNdx)[(long)compNdx_1 * 2];
      *(deUint32 *)(lVar2 + (long)(int)(local_5c * iVar4 + base0) * 4) =
           easyCases[(long)compNdx_1 + -1].y;
    }
    local_5c = local_5c + 1;
  }
  for (; local_5c < numValues; local_5c = local_5c + 1) {
    for (base1 = 0; (int)base1 < iVar4; base1 = base1 + 1) {
      dVar3 = de::Random::getUint32((Random *)&scalarSize);
      dVar5 = de::Random::getUint32((Random *)&scalarSize);
      iVar6 = de::Random::getInt((Random *)&scalarSize,0,0x14);
      iVar7 = de::Random::getInt((Random *)&scalarSize,0,0x14);
      *(deUint32 *)(lVar1 + (long)(int)(local_5c * iVar4 + base1) * 4) =
           dVar3 >> ((byte)iVar6 & 0x1f);
      *(deUint32 *)(lVar2 + (long)(int)(local_5c * iVar4 + base1) * 4) =
           dVar5 >> ((byte)iVar7 & 0x1f);
    }
  }
  de::Random::~Random((Random *)&scalarSize);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(m_name) ^ 0x235facu);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
//		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);
		deUint32*				in0			= (deUint32*)values[0];
		deUint32*				in1			= (deUint32*)values[1];
		int						valueNdx	= 0;

		const struct
		{
			deUint32	x;
			deUint32	y;
		} easyCases[] =
		{
			{ 0x00000000u,	0x00000000u },
			{ 0xffffffffu,	0x00000001u },
			{ 0xffffffffu,	0x00000002u },
			{ 0x00000001u,	0xffffffffu },
			{ 0x00000002u,	0xffffffffu },
			{ 0xffffffffu,	0xffffffffu },
		};

		for (int easyCaseNdx = 0; easyCaseNdx < DE_LENGTH_OF_ARRAY(easyCases); easyCaseNdx++)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				in0[valueNdx*scalarSize + compNdx] = easyCases[easyCaseNdx].x;
				in1[valueNdx*scalarSize + compNdx] = easyCases[easyCaseNdx].y;
			}

			valueNdx += 1;
		}

		while (valueNdx < numValues)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const deUint32	base0	= rnd.getUint32();
				const deUint32	base1	= rnd.getUint32();
				const int		adj0	= rnd.getInt(0, 20);
				const int		adj1	= rnd.getInt(0, 20);
				in0[valueNdx*scalarSize + compNdx] = base0 >> adj0;
				in1[valueNdx*scalarSize + compNdx] = base1 >> adj1;
			}

			valueNdx += 1;
		}
	}